

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void vmsa_tcr_ttbr_el2_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t uVar1;
  CPUARMState_conflict *__mptr;
  
  uVar1 = raw_read(env,ri);
  if ((uVar1 ^ value) >> 0x30 != 0) {
    uVar1 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar1 >> 0x22 & 1) != 0) {
      tlb_flush_by_mmuidx_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),0x62);
    }
  }
  raw_write(env,ri,value);
  return;
}

Assistant:

static void vmsa_tcr_ttbr_el2_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                    uint64_t value)
{
    /*
     * If we are running with E2&0 regime, then an ASID is active.
     * Flush if that might be changing.  Note we're not checking
     * TCR_EL2.A1 to know if this is really the TTBRx_EL2 that
     * holds the active ASID, only checking the field that might.
     */
    if (extract64(raw_read(env, ri) ^ value, 48, 16) &&
        (arm_hcr_el2_eff(env) & HCR_E2H)) {
        tlb_flush_by_mmuidx(env_cpu(env),
                            ARMMMUIdxBit_E20_2 |
                            ARMMMUIdxBit_E20_2_PAN |
                            ARMMMUIdxBit_E20_0);
    }
    raw_write(env, ri, value);
}